

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O2

void llvm::format_provider<unsigned_int,_void>::format(uint *V,raw_ostream *Stream,StringRef Style)

{
  bool bVar1;
  size_t sVar2;
  undefined8 in_R9;
  IntegerStyle Style_00;
  StringRef Prefix;
  StringRef Prefix_00;
  StringRef Prefix_01;
  StringRef Prefix_02;
  Optional<unsigned_long> Width;
  unsigned_long local_48;
  undefined1 local_40 [8];
  StringRef Style_local;
  HexPrintStyle HS;
  
  Style_local.Data = (char *)Style.Length;
  local_40 = (undefined1  [8])Style.Data;
  local_48 = 0;
  bVar1 = detail::HelperFunctions::consumeHexStyle
                    ((StringRef *)local_40,(HexPrintStyle *)((long)&Style_local.Length + 4));
  if (bVar1) {
    sVar2 = detail::HelperFunctions::consumeNumHexDigits
                      ((StringRef *)local_40,Style_local.Length._4_4_,0);
    Width.Storage._8_8_ = in_R9;
    Width.Storage.field_0.value = 1;
    write_hex((llvm *)Stream,(raw_ostream *)(ulong)*V,(ulong)Style_local.Length._4_4_,
              (HexPrintStyle)sVar2,Width);
  }
  else {
    Prefix.Length = 1;
    Prefix.Data = "N";
    bVar1 = StringRef::consume_front((StringRef *)local_40,Prefix);
    Style_00 = Number;
    if (!bVar1) {
      Prefix_00.Length = 1;
      Prefix_00.Data = "n";
      bVar1 = StringRef::consume_front((StringRef *)local_40,Prefix_00);
      if (!bVar1) {
        Prefix_01.Length = 1;
        Prefix_01.Data = "D";
        bVar1 = StringRef::consume_front((StringRef *)local_40,Prefix_01);
        Style_00 = Integer;
        if (!bVar1) {
          Prefix_02.Length = 1;
          Prefix_02.Data = "d";
          StringRef::consume_front((StringRef *)local_40,Prefix_02);
        }
      }
    }
    StringRef::consumeInteger<unsigned_long>((StringRef *)local_40,10,&local_48);
    if (Style_local.Data != (char *)0x0) {
      __assert_fail("Style.empty() && \"Invalid integral format style!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0x93,
                    "static void llvm::format_provider<unsigned int>::format(const T &, llvm::raw_ostream &, StringRef) [T = unsigned int, Enable = void]"
                   );
    }
    write_integer(Stream,*V,local_48,Style_00);
  }
  return;
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    HexPrintStyle HS;
    size_t Digits = 0;
    if (consumeHexStyle(Style, HS)) {
      Digits = consumeNumHexDigits(Style, HS, 0);
      write_hex(Stream, V, HS, Digits);
      return;
    }

    IntegerStyle IS = IntegerStyle::Integer;
    if (Style.consume_front("N") || Style.consume_front("n"))
      IS = IntegerStyle::Number;
    else if (Style.consume_front("D") || Style.consume_front("d"))
      IS = IntegerStyle::Integer;

    Style.consumeInteger(10, Digits);
    assert(Style.empty() && "Invalid integral format style!");
    write_integer(Stream, V, Digits, IS);
  }